

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2.c
# Opt level: O0

void argon2_internal(uint32_t p,uint32_t T,uint32_t m,uint32_t t,uint32_t y,ptrlen P,ptrlen S,
                    ptrlen K,ptrlen X,uint8_t *out)

{
  ulong uVar1;
  uint32_t uVar2;
  ssh_hash *psVar3;
  ulong uVar4;
  size_t factor1;
  void *__s;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  ulong local_1160;
  ulong local_1158;
  ssh_hash *h_3;
  size_t i_3;
  blk C;
  uint32_t index_z;
  uint32_t zz;
  uint32_t y_1;
  uint32_t x;
  uint32_t Wsize;
  uint32_t Wend;
  uint32_t Wstart;
  uint32_t index_l;
  uint32_t J2;
  uint32_t J1;
  uint32_t jm1;
  size_t j;
  size_t jpre;
  size_t i_2;
  ulong uStack_cc8;
  uint slice;
  size_t pass;
  blk in2i;
  blk tmp2i;
  blk out2i;
  _Bool d_mode;
  size_t jstart;
  ssh_hash *h_2;
  size_t i_1;
  ssh_hash *h_1;
  size_t i;
  blk *B;
  size_t mprime;
  size_t q;
  size_t SL;
  ssh_hash *h;
  uint8_t h0 [64];
  uint8_t *out_local;
  uint32_t y_local;
  uint32_t t_local;
  uint32_t m_local;
  uint32_t T_local;
  uint32_t p_local;
  
  h0._56_8_ = out;
  psVar3 = blake2b_new_general(0x40);
  BinarySink_put_uint32_le(psVar3->binarysink_,(ulong)p);
  BinarySink_put_uint32_le(psVar3->binarysink_,(ulong)T);
  BinarySink_put_uint32_le(psVar3->binarysink_,(ulong)m);
  BinarySink_put_uint32_le(psVar3->binarysink_,(ulong)t);
  BinarySink_put_uint32_le(psVar3->binarysink_,0x13);
  BinarySink_put_uint32_le(psVar3->binarysink_,(ulong)y);
  BinarySink_put_stringpl_le(psVar3->binarysink_,P);
  BinarySink_put_stringpl_le(psVar3->binarysink_,S);
  BinarySink_put_stringpl_le(psVar3->binarysink_,K);
  BinarySink_put_stringpl_le(psVar3->binarysink_,X);
  ssh_hash_final(psVar3,(uchar *)&h);
  uVar1 = (ulong)m / (ulong)(p << 2);
  uVar4 = uVar1 * 4;
  factor1 = uVar4 * p;
  __s = safemalloc(factor1,0x400,0);
  memset(__s,0,factor1 * 0x400);
  for (h_1 = (ssh_hash *)0x0; h_1 < (ssh_hash *)(ulong)p; h_1 = (ssh_hash *)((long)&h_1->vt + 1)) {
    psVar3 = hprime_new(0x400);
    BinarySink_put_data(psVar3->binarysink_,&h,0x40);
    BinarySink_put_uint32_le(psVar3->binarysink_,0);
    BinarySink_put_uint32_le(psVar3->binarysink_,(unsigned_long)h_1);
    hprime_final(psVar3,0x400,(void *)((long)__s + (long)h_1 * 0x400));
  }
  for (h_2 = (ssh_hash *)0x0; h_2 < (ssh_hash *)(ulong)p; h_2 = (ssh_hash *)((long)&h_2->vt + 1)) {
    psVar3 = hprime_new(0x400);
    BinarySink_put_data(psVar3->binarysink_,&h,0x40);
    BinarySink_put_uint32_le(psVar3->binarysink_,1);
    BinarySink_put_uint32_le(psVar3->binarysink_,(unsigned_long)h_2);
    hprime_final(psVar3,0x400,(void *)((long)__s + ((long)&h_2->vt + (ulong)p) * 0x400));
  }
  stack0xffffffffffffff48 = 2;
  bVar7 = y == 0;
  for (uStack_cc8 = 0; uStack_cc8 < t; uStack_cc8 = uStack_cc8 + 1) {
    for (i_2._4_4_ = 0; i_2._4_4_ < 4; i_2._4_4_ = i_2._4_4_ + 1) {
      if (((uStack_cc8 == 0) && (i_2._4_4_ == 2)) && (y == 2)) {
        bVar7 = true;
      }
      for (jpre = 0; jpre < p; jpre = jpre + 1) {
        for (j = stack0xffffffffffffff48; j < uVar1; j = j + 1) {
          uVar5 = i_2._4_4_ * uVar1 + j;
          uVar6 = uVar5;
          if (uVar5 == 0) {
            uVar6 = uVar4;
          }
          uVar2 = (int)uVar6 - 1;
          if (bVar7) {
            index_l = GET_32BIT_LSB_FIRST((void *)((long)__s + (jpre + p * uVar2) * 0x400));
            Wstart = GET_32BIT_LSB_FIRST((void *)((long)__s + (jpre + p * uVar2) * 0x400 + 4));
          }
          else {
            if ((j == stack0xffffffffffffff48) || ((j & 0x7f) == 0)) {
              memset((void *)((long)&pass + 7),0,0x400);
              PUT_64BIT_LSB_FIRST((void *)((long)&pass + 7),uStack_cc8);
              PUT_64BIT_LSB_FIRST(&in2i,jpre);
              PUT_64BIT_LSB_FIRST(in2i.data + 8,(ulong)i_2._4_4_);
              PUT_64BIT_LSB_FIRST(in2i.data + 0x10,factor1);
              PUT_64BIT_LSB_FIRST(in2i.data + 0x18,(ulong)t);
              PUT_64BIT_LSB_FIRST(in2i.data + 0x20,(ulong)y);
              PUT_64BIT_LSB_FIRST(in2i.data + 0x28,(j >> 7) + 1);
              memset(in2i.data + 0x3f8,0,0x400);
              G_xor(in2i.data + 0x3f8,in2i.data + 0x3f8,(uint8_t *)((long)&pass + 7));
              memset(tmp2i.data + 0x3f8,0,0x400);
              G_xor(tmp2i.data + 0x3f8,tmp2i.data + 0x3f8,in2i.data + 0x3f8);
            }
            index_l = GET_32BIT_LSB_FIRST(out2i.data + (j & 0x7f) * 8 + -8);
            Wstart = GET_32BIT_LSB_FIRST(out2i.data + (j & 0x7f) * 8 + -4);
          }
          if ((uStack_cc8 == 0) && (i_2._4_4_ == 0)) {
            local_1158 = jpre;
          }
          else {
            local_1158 = (ulong)Wstart % (ulong)p;
          }
          if (uStack_cc8 == 0) {
            local_1160 = 0;
          }
          else {
            local_1160 = (i_2._4_4_ + 1 & 3) * uVar1;
          }
          x = uVar2;
          if (((local_1158 & 0xffffffff) != jpre) && (x = (int)uVar1 * i_2._4_4_, j == 0)) {
            x = (uint32_t)(((x + uVar4) - 1) % uVar4);
          }
          uVar6 = ((x + uVar4) - (local_1160 & 0xffffffff)) % uVar4;
          C.data._1020_4_ =
               ((int)uVar6 + -1) -
               (int)((uVar6 & 0xffffffff) * ((ulong)index_l * (ulong)index_l >> 0x20) >> 0x20);
          C.data._1016_4_ = SUB84((ulong)(uint)((int)local_1160 + C.data._1020_4_) % uVar4,0);
          G_xor((uint8_t *)((long)__s + (jpre + p * uVar5) * 0x400),
                (uint8_t *)((long)__s + (jpre + p * uVar2) * 0x400),
                (uint8_t *)((long)__s + (ulong)((int)local_1158 + p * C.data._1016_4_) * 0x400));
        }
      }
      stack0xffffffffffffff48 = 0;
    }
  }
  memcpy((void *)((long)&i_3 + 4),(void *)((long)__s + (ulong)p * (uVar4 - 1) * 0x400),0x400);
  for (h_3 = (ssh_hash *)0x1; h_3 < (ssh_hash *)(ulong)p; h_3 = (ssh_hash *)((long)&h_3->vt + 1)) {
    memxor((uint8_t *)((long)&i_3 + 4),(uint8_t *)((long)&i_3 + 4),
           (uint8_t *)((long)__s + (long)((long)&h_3->vt + (ulong)p * (uVar4 - 1)) * 0x400),0x400);
  }
  psVar3 = hprime_new(T);
  BinarySink_put_data(psVar3->binarysink_,(void *)((long)&i_3 + 4),0x400);
  hprime_final(psVar3,T,(void *)h0._56_8_);
  smemclr(tmp2i.data + 0x3f8,0x400);
  smemclr(in2i.data + 0x3f8,0x400);
  smemclr((void *)((long)&pass + 7),0x400);
  smemclr((void *)((long)&i_3 + 4),0x400);
  smemclr(__s,factor1 * 0x400);
  safefree(__s);
  return;
}

Assistant:

static void argon2_internal(uint32_t p, uint32_t T, uint32_t m, uint32_t t,
                            uint32_t y, ptrlen P, ptrlen S, ptrlen K, ptrlen X,
                            uint8_t *out)
{
    /*
     * Start by hashing all the input data together: the four string arguments
     * (password P, salt S, optional secret key K, optional associated data
     * X), plus all the parameters for the function's memory and time usage.
     *
     * The output of this hash is the sole input to the subsequent mixing
     * step: Argon2 does not preserve any more entropy from the inputs, it
     * just makes it extra painful to get the final answer.
     */
    uint8_t h0[64];
    {
        ssh_hash *h = blake2b_new_general(64);
        put_uint32_le(h, p);
        put_uint32_le(h, T);
        put_uint32_le(h, m);
        put_uint32_le(h, t);
        put_uint32_le(h, 0x13);        /* hash function version number */
        put_uint32_le(h, y);
        put_stringpl_le(h, P);
        put_stringpl_le(h, S);
        put_stringpl_le(h, K);
        put_stringpl_le(h, X);
        ssh_hash_final(h, h0);
    }

    struct blk { uint8_t data[1024]; };

    /*
     * Array of 1Kb blocks. The total size is (approximately) m, the
     * caller-specified parameter for how much memory to use; the blocks are
     * regarded as a rectangular array of p rows ('lanes') by q columns, where
     * p is the 'parallelism' input parameter (the lanes can be processed
     * concurrently up to a point) and q is whatever makes the product pq come
     * to m.
     *
     * Additionally, each row is divided into four equal 'segments', which are
     * important to the way the algorithm decides which blocks to use as input
     * to each step of the function.
     *
     * The term 'slice' refers to a whole set of vertically aligned segments,
     * i.e. slice 0 is the whole left quarter of the array, and slice 3 the
     * whole right quarter.
     */
    size_t SL = m / (4*p); /* segment length: # of 1Kb blocks in a segment */
    size_t q = 4 * SL;     /* width of the array: 4 segments times SL */
    size_t mprime = q * p; /* total size of the array, approximately m */

    /* Allocate the memory. */
    struct blk *B = snewn(mprime, struct blk);
    memset(B, 0, mprime * sizeof(struct blk));

    /*
     * Initial setup: fill the first two full columns of the array with data
     * expanded from the starting hash h0. Each block is the result of using
     * the long-output hash function H' to hash h0 itself plus the block's
     * coordinates in the array.
     */
    for (size_t i = 0; i < p; i++) {
        ssh_hash *h = hprime_new(1024);
        put_data(h, h0, 64);
        put_uint32_le(h, 0);
        put_uint32_le(h, i);
        hprime_final(h, 1024, B[i].data);
    }
    for (size_t i = 0; i < p; i++) {
        ssh_hash *h = hprime_new(1024);
        put_data(h, h0, 64);
        put_uint32_le(h, 1);
        put_uint32_le(h, i);
        hprime_final(h, 1024, B[i+p].data);
    }

    /*
     * Declarations for the main loop.
     *
     * The basic structure of the main loop is going to involve processing the
     * array one whole slice (vertically divided quarter) at a time. Usually
     * we'll write a new value into every single block in the slice, except
     * that in the initial slice on the first pass, we've already written
     * values into the first two columns during the initial setup above. So
     * 'jstart' indicates the starting index in each segment we process; it
     * starts off as 2 so that we don't overwrite the initial setup, and then
     * after the first slice is done, we set it to 0, and it stays there.
     *
     * d_mode indicates whether we're being data-dependent (true) or
     * data-independent (false). In the hybrid Argon2id mode, we start off
     * independent, and then once we've mixed things up enough, switch over to
     * dependent mode to force long serial chains of computation.
     */
    size_t jstart = 2;
    bool d_mode = (y == 0);
    struct blk out2i, tmp2i, in2i;

    /* Outermost loop: t whole passes from left to right over the array */
    for (size_t pass = 0; pass < t; pass++) {

        /* Within that, we process the array in its four main slices */
        for (unsigned slice = 0; slice < 4; slice++) {

            /* In Argon2id mode, if we're half way through the first pass,
             * this is the moment to switch d_mode from false to true */
            if (pass == 0 && slice == 2 && y == 2)
                d_mode = true;

            /* Loop over every segment in the slice (i.e. every row). So i is
             * the y-coordinate of each block we process. */
            for (size_t i = 0; i < p; i++) {

                /* And within that segment, process the blocks from left to
                 * right, starting at 'jstart' (usually 0, but 2 in the first
                 * slice). */
                for (size_t jpre = jstart; jpre < SL; jpre++) {

                    /* j is the x-coordinate of each block we process, made up
                     * of the slice number and the index 'jpre' within the
                     * segment. */
                    size_t j = slice * SL + jpre;

                    /* jm1 is j-1 (mod q) */
                    uint32_t jm1 = (j == 0 ? q-1 : j-1);

                    /*
                     * Construct two 32-bit pseudorandom integers J1 and J2.
                     * This is the part of the algorithm that varies between
                     * the data-dependent and independent modes.
                     */
                    uint32_t J1, J2;
                    if (d_mode) {
                        /*
                         * Data-dependent: grab the first 64 bits of the block
                         * to the left of this one.
                         */
                        J1 = GET_32BIT_LSB_FIRST(B[i + p * jm1].data);
                        J2 = GET_32BIT_LSB_FIRST(B[i + p * jm1].data + 4);
                    } else {
                        /*
                         * Data-independent: generate pseudorandom data by
                         * hashing a sequence of preimage blocks that include
                         * all our input parameters, plus the coordinates of
                         * this point in the algorithm (array position and
                         * pass number) to make all the hash outputs distinct.
                         *
                         * The hash we use is G itself, applied twice. So we
                         * generate 1Kb of data at a time, which is enough for
                         * 128 (J1,J2) pairs. Hence we only need to do the
                         * hashing if our index within the segment is a
                         * multiple of 128, or if we're at the very start of
                         * the algorithm (in which case we started at 2 rather
                         * than 0). After that we can just keep picking data
                         * out of our most recent hash output.
                         */
                        if (jpre == jstart || jpre % 128 == 0) {
                            /*
                             * Hash preimage is mostly zeroes, with a
                             * collection of assorted integer values we had
                             * anyway.
                             */
                            memset(in2i.data, 0, sizeof(in2i.data));
                            PUT_64BIT_LSB_FIRST(in2i.data +  0, pass);
                            PUT_64BIT_LSB_FIRST(in2i.data +  8, i);
                            PUT_64BIT_LSB_FIRST(in2i.data + 16, slice);
                            PUT_64BIT_LSB_FIRST(in2i.data + 24, mprime);
                            PUT_64BIT_LSB_FIRST(in2i.data + 32, t);
                            PUT_64BIT_LSB_FIRST(in2i.data + 40, y);
                            PUT_64BIT_LSB_FIRST(in2i.data + 48, jpre / 128 + 1);

                            /*
                             * Now apply G twice to generate the hash output
                             * in out2i.
                             */
                            memset(tmp2i.data, 0, sizeof(tmp2i.data));
                            G_xor(tmp2i.data, tmp2i.data, in2i.data);
                            memset(out2i.data, 0, sizeof(out2i.data));
                            G_xor(out2i.data, out2i.data, tmp2i.data);
                        }

                        /*
                         * Extract J1 and J2 from the most recent hash output
                         * (whether we've just computed it or not).
                         */
                        J1 = GET_32BIT_LSB_FIRST(
                            out2i.data + 8 * (jpre % 128));
                        J2 = GET_32BIT_LSB_FIRST(
                            out2i.data + 8 * (jpre % 128) + 4);
                    }

                    /*
                     * Now convert J1 and J2 into the index of an existing
                     * block of the array to use as input to this step. This
                     * is fairly fiddly.
                     *
                     * The easy part: the y-coordinate of the input block is
                     * obtained by reducing J2 mod p, except that at the very
                     * start of the algorithm (processing the first slice on
                     * the first pass) we simply use the same y-coordinate as
                     * our output block.
                     *
                     * Note that it's safe to use the ordinary % operator
                     * here, without any concern for timing side channels: in
                     * data-independent mode J2 is not correlated to any
                     * secrets, and in data-dependent mode we're going to be
                     * giving away side-channel data _anyway_ when we use it
                     * as an array index (and by assumption we don't care,
                     * because it's already massively randomised from the real
                     * inputs).
                     */
                    uint32_t index_l = (pass == 0 && slice == 0) ? i : J2 % p;

                    /*
                     * The hard part: which block in this array row do we use?
                     *
                     * First, we decide what the possible candidates are. This
                     * requires some case analysis, and depends on whether the
                     * array row is the same one we're writing into or not.
                     *
                     * If it's not the same row: we can't use any block from
                     * the current slice (because the segments within a slice
                     * have to be processable in parallel, so in a concurrent
                     * implementation those blocks are potentially in the
                     * process of being overwritten by other threads). But the
                     * other three slices are fair game, except that in the
                     * first pass, slices to the right of us won't have had
                     * any values written into them yet at all.
                     *
                     * If it is the same row, we _are_ allowed to use blocks
                     * from the current slice, but only the ones before our
                     * current position.
                     *
                     * In both cases, we also exclude the individual _column_
                     * just to the left of the current one. (The block
                     * immediately to our left is going to be the _other_
                     * input to G, but the spec also says that we avoid that
                     * column even in a different row.)
                     *
                     * All of this means that we end up choosing from a
                     * cyclically contiguous interval of blocks within this
                     * lane, but the start and end points require some thought
                     * to get them right.
                     */

                    /* Start position is the beginning of the _next_ slice
                     * (containing data from the previous pass), unless we're
                     * on pass 0, where the start position has to be 0. */
                    uint32_t Wstart = (pass == 0 ? 0 : (slice + 1) % 4 * SL);

                    /* End position splits up by cases. */
                    uint32_t Wend;
                    if (index_l == i) {
                        /* Same lane as output: we can use anything up to (but
                         * not including) the block immediately left of us. */
                        Wend = jm1;
                    } else {
                        /* Different lane from output: we can use anything up
                         * to the previous slice boundary, or one less than
                         * that if we're at the very left edge of our slice
                         * right now. */
                        Wend = SL * slice;
                        if (jpre == 0)
                            Wend = (Wend + q-1) % q;
                    }

                    /* Total number of blocks available to choose from */
                    uint32_t Wsize = (Wend + q - Wstart) % q;

                    /* Fiddly computation from the spec that chooses from the
                     * available blocks, in a deliberately non-uniform
                     * fashion, using J1 as pseudorandom input data. Output is
                     * zz which is the index within our contiguous interval. */
                    uint32_t x = ((uint64_t)J1 * J1) >> 32;
                    uint32_t y = ((uint64_t)Wsize * x) >> 32;
                    uint32_t zz = Wsize - 1 - y;

                    /* And index_z is the actual x coordinate of the block we
                     * want. */
                    uint32_t index_z = (Wstart + zz) % q;

                    /* Phew! Combine that block with the one immediately to
                     * our left, and XOR over the top of whatever is already
                     * in our current output block. */
                    G_xor(B[i + p * j].data, B[i + p * jm1].data,
                          B[index_l + p * index_z].data);
                }
            }

            /* We've finished processing a slice. Reset jstart to 0. It will
             * onily _not_ have been 0 if this was pass 0 slice 0, in which
             * case it still had its initial value of 2 to avoid the starting
             * data. */
            jstart = 0;
        }
    }

    /*
     * The main output is all done. Final output works by taking the XOR of
     * all the blocks in the rightmost column of the array, and then using
     * that as input to our long hash H'. The output of _that_ is what we
     * deliver to the caller.
     */

    struct blk C = B[p * (q-1)];
    for (size_t i = 1; i < p; i++)
        memxor(C.data, C.data, B[i + p * (q-1)].data, 1024);

    {
        ssh_hash *h = hprime_new(T);
        put_data(h, C.data, 1024);
        hprime_final(h, T, out);
    }

    /*
     * Clean up.
     */
    smemclr(out2i.data, sizeof(out2i.data));
    smemclr(tmp2i.data, sizeof(tmp2i.data));
    smemclr(in2i.data, sizeof(in2i.data));
    smemclr(C.data, sizeof(C.data));
    smemclr(B, mprime * sizeof(struct blk));
    sfree(B);
}